

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_socket(int domain,int protocol)

{
  short *psVar1;
  undefined2 uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong in_RAX;
  long lVar7;
  char *pcVar8;
  nn_sock **ppnVar9;
  nn_list_item *pnVar10;
  nn_list_item *pnVar11;
  nn_sock *self;
  nn_list_item **ppnVar12;
  int *piVar13;
  nn_socktype *unaff_RBP;
  ulong uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  nn_sock *pnStack_70;
  ulong uStack_68;
  ulong uStack_60;
  nn_socktype *pnStack_58;
  ulong uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  uVar3 = (ulong)(uint)protocol;
  uVar14 = (ulong)(uint)domain;
  pcStack_40 = (code *)0x11edbc;
  uStack_38 = in_RAX;
  nn_glock_lock();
  if ((::self.flags & 1U) == 0) {
    if (::self.socks == (nn_sock **)0x0) {
      pcStack_40 = (code *)0x11eddc;
      nn_alloc_init();
      pcStack_40 = (code *)0x11ede3;
      nn_random_seed();
      iVar6 = 0x1400;
      pcStack_40 = (code *)0x11eded;
      ::self.socks = (nn_sock **)nn_alloc_(0x1400);
      if (::self.socks == (nn_sock **)0x0) {
LAB_0011f2f3:
        pcStack_40 = (code *)0x11f2f8;
        nn_socket_cold_5();
LAB_0011f2f8:
        pcStack_40 = nn_global_term;
        nn_socket_cold_2();
        uStack_48 = uVar3;
        pcStack_40 = (code *)uVar14;
        if (::self.socks != (nn_sock **)0x0) {
          if (::self.nsocks == 0) {
            pnStack_58 = (nn_socktype *)0x11f32d;
            nn_pool_term(&::self.pool);
            pnStack_58 = (nn_socktype *)0x11f339;
            iVar6 = nn_list_empty(&::self.transports);
            while (iVar6 == 0) {
              pnStack_58 = (nn_socktype *)0x11f34c;
              pnVar10 = nn_list_begin(&::self.transports);
              ppnVar12 = &pnVar10[-4].prev;
              if (pnVar10 == (nn_list_item *)0x0) {
                ppnVar12 = (nn_list_item **)0x0;
              }
              if (ppnVar12[3] != (nn_list_item *)0x0) {
                pnStack_58 = (nn_socktype *)0x11f365;
                (*(code *)ppnVar12[3])();
              }
              pnStack_58 = (nn_socktype *)0x11f370;
              nn_list_erase(&::self.transports,pnVar10);
              pnStack_58 = (nn_socktype *)0x11f378;
              iVar6 = nn_list_empty(&::self.transports);
            }
            pnStack_58 = (nn_socktype *)0x11f388;
            iVar6 = nn_list_empty(&::self.socktypes);
            while (iVar6 == 0) {
              pnStack_58 = (nn_socktype *)0x11f39b;
              pnVar10 = nn_list_begin(&::self.socktypes);
              pnStack_58 = (nn_socktype *)0x11f3a6;
              nn_list_erase(&::self.socktypes,pnVar10);
              pnStack_58 = (nn_socktype *)0x11f3ae;
              iVar6 = nn_list_empty(&::self.socktypes);
            }
            pnStack_58 = (nn_socktype *)0x11f3be;
            nn_list_term(&::self.socktypes);
            pnStack_58 = (nn_socktype *)0x11f3ca;
            nn_list_term(&::self.transports);
            pnStack_58 = (nn_socktype *)0x11f3d6;
            nn_free(::self.socks);
            ::self.socks = (nn_sock **)0x0;
            nn_alloc_term();
            return extraout_EAX_00;
          }
          return extraout_EAX;
        }
        pnStack_58 = (nn_socktype *)nn_close;
        nn_global_term_cold_1();
        uStack_68 = uVar3;
        uStack_60 = uVar14;
        pnStack_58 = unaff_RBP;
        nn_glock_lock();
        iVar5 = nn_global_hold_socket_locked(&pnStack_70,iVar6);
        if (iVar5 < 0) {
          nn_glock_unlock();
          piVar13 = __errno_location();
          *piVar13 = -iVar5;
        }
        else {
          nn_sock_stop(pnStack_70);
          nn_sock_rele(pnStack_70);
          nn_sock_rele(pnStack_70);
          nn_glock_unlock();
          iVar5 = nn_sock_term(pnStack_70);
          if (iVar5 != -4) {
            nn_glock_lock();
            ::self.socks[iVar6] = (nn_sock *)0x0;
            ::self.unused[0x200 - ::self.nsocks] = (uint16_t)iVar6;
            ::self.nsocks = ::self.nsocks - 1;
            nn_free(pnStack_70);
            nn_global_term();
            nn_glock_unlock();
            return 0;
          }
          nn_global_rele_socket(pnStack_70);
          piVar13 = __errno_location();
          *piVar13 = 4;
        }
        return -1;
      }
      lVar7 = 0;
      do {
        ::self.socks[lVar7] = (nn_sock *)0x0;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x200);
      ::self.nsocks = 0;
      ::self.flags = 0;
      pcStack_40 = (code *)0x11ee3a;
      pcVar8 = getenv("NN_PRINT_ERRORS");
      ::self.print_errors = 0;
      if (pcVar8 != (char *)0x0) {
        ::self.print_errors = (int)(*pcVar8 != '\0');
      }
      ppnVar9 = ::self.socks + 0x200;
      sVar15 = 0;
      sVar16 = 1;
      sVar17 = 2;
      sVar18 = 3;
      sVar19 = 4;
      sVar20 = 5;
      sVar21 = 6;
      sVar22 = 7;
      lVar7 = 0;
      ::self.unused = (uint16_t *)ppnVar9;
      do {
        psVar1 = (short *)((long)ppnVar9 + lVar7 * 2);
        *psVar1 = 0x1ff - sVar15;
        psVar1[1] = 0x1ff - sVar16;
        psVar1[2] = 0x1ff - sVar17;
        psVar1[3] = 0x1ff - sVar18;
        psVar1[4] = 0x1ff - sVar19;
        psVar1[5] = 0x1ff - sVar20;
        psVar1[6] = 0x1ff - sVar21;
        psVar1[7] = 0x1ff - sVar22;
        lVar7 = lVar7 + 8;
        sVar15 = sVar15 + 8;
        sVar16 = sVar16 + 8;
        sVar17 = sVar17 + 8;
        sVar18 = sVar18 + 8;
        sVar19 = sVar19 + 8;
        sVar20 = sVar20 + 8;
        sVar21 = sVar21 + 8;
        sVar22 = sVar22 + 8;
      } while (lVar7 != 0x200);
      pcStack_40 = (code *)0x11eea4;
      nn_list_init(&::self.transports);
      pcStack_40 = (code *)0x11eeb3;
      nn_list_init(&::self.socktypes);
      pcStack_40 = (code *)0x11eec2;
      nn_global_add_transport(nn_inproc);
      pcStack_40 = (code *)0x11eed1;
      nn_global_add_transport(nn_ipc);
      pcStack_40 = (code *)0x11eee0;
      nn_global_add_transport(nn_tcp);
      pcStack_40 = (code *)0x11eeef;
      nn_global_add_transport(nn_ws);
      pnVar11 = &nn_pair_socktype->item;
      pcStack_40 = (code *)0x11ef05;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11ef13;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xpair_socktype->item;
      pcStack_40 = (code *)0x11ef29;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11ef37;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_pub_socktype->item;
      pcStack_40 = (code *)0x11ef4d;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11ef5b;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_sub_socktype->item;
      pcStack_40 = (code *)0x11ef71;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11ef7f;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xpub_socktype->item;
      pcStack_40 = (code *)0x11ef95;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11efa3;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xsub_socktype->item;
      pcStack_40 = (code *)0x11efb9;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11efc7;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_rep_socktype->item;
      pcStack_40 = (code *)0x11efdd;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11efeb;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_req_socktype->item;
      pcStack_40 = (code *)0x11f001;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f00f;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xrep_socktype->item;
      pcStack_40 = (code *)0x11f025;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f033;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xreq_socktype->item;
      pcStack_40 = (code *)0x11f049;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f057;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_push_socktype->item;
      pcStack_40 = (code *)0x11f06d;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f07b;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xpush_socktype->item;
      pcStack_40 = (code *)0x11f091;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f09f;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_pull_socktype->item;
      pcStack_40 = (code *)0x11f0b5;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f0c3;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xpull_socktype->item;
      pcStack_40 = (code *)0x11f0d9;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f0e7;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_respondent_socktype->item;
      pcStack_40 = (code *)0x11f0fd;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f10b;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_surveyor_socktype->item;
      pcStack_40 = (code *)0x11f121;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f12f;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xrespondent_socktype->item;
      pcStack_40 = (code *)0x11f145;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f153;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xsurveyor_socktype->item;
      pcStack_40 = (code *)0x11f169;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f177;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_bus_socktype->item;
      pcStack_40 = (code *)0x11f18d;
      pnVar10 = nn_list_end(&::self.socktypes);
      pcStack_40 = (code *)0x11f19b;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pnVar11 = &nn_xbus_socktype->item;
      pcStack_40 = (code *)0x11f1b1;
      pnVar10 = nn_list_end(&::self.socktypes);
      iVar6 = 0x14b5c8;
      pcStack_40 = (code *)0x11f1bf;
      nn_list_insert(&::self.socktypes,pnVar11,pnVar10);
      pcStack_40 = (code *)0x11f1c4;
      iVar5 = nn_setup_atfork_handlers();
      if (iVar5 != 0) goto LAB_0011f2f8;
      pcStack_40 = (code *)0x11f1d8;
      nn_pool_init(&::self.pool);
    }
    if ((0xfffffffd < domain - 3U) && (::self.nsocks < 0x200)) {
      uVar2 = *(undefined2 *)((long)::self.unused + (ulong)(uint)((0x1ff - (int)::self.nsocks) * 2))
      ;
      pcStack_40 = (code *)0x11f21b;
      pnVar10 = nn_list_begin(&::self.socktypes);
      pcStack_40 = (code *)0x11f226;
      pnVar11 = nn_list_end(&::self.socktypes);
      if (pnVar10 != pnVar11) {
        uStack_38 = (ulong)CONCAT24(uVar2,(undefined4)uStack_38);
        do {
          unaff_RBP = (nn_socktype *)(pnVar10 + -2);
          if (pnVar10 == (nn_list_item *)0x0) {
            unaff_RBP = (nn_socktype *)0x0;
          }
          if ((unaff_RBP->domain == domain) && (unaff_RBP->protocol == protocol)) {
            iVar6 = 0x250;
            pcStack_40 = (code *)0x11f27e;
            self = (nn_sock *)nn_alloc_(0x250);
            if (self == (nn_sock *)0x0) {
              pcStack_40 = (code *)0x11f2f3;
              nn_socket_cold_3();
              goto LAB_0011f2f3;
            }
            uVar4 = uStack_38._4_4_;
            pcStack_40 = (code *)0x11f297;
            iVar6 = nn_sock_init(self,unaff_RBP,uStack_38._4_4_);
            if (-1 < iVar6) {
              ::self.socks[uVar4] = self;
              ::self.nsocks = ::self.nsocks + 1;
              pcStack_40 = (code *)0x11f2b4;
              nn_glock_unlock();
              return uVar4;
            }
            break;
          }
          pcStack_40 = (code *)0x11f262;
          pnVar10 = nn_list_next(&::self.socktypes,pnVar10);
          pcStack_40 = (code *)0x11f26d;
          pnVar11 = nn_list_end(&::self.socktypes);
        } while (pnVar10 != pnVar11);
      }
    }
    pcStack_40 = (code *)0x11f2c1;
    nn_socket_cold_4();
  }
  else {
    pcStack_40 = (code *)0x11f2dc;
    nn_socket_cold_1();
  }
  return -1;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_glock_lock ();

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_ZOMBIE)) {
        nn_glock_unlock ();
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_glock_unlock ();
        errno = -rc;
        return -1;
    }

    nn_glock_unlock();

    return rc;
}